

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O3

bool __thiscall
FIX::double_conversion::ComputeGuess
          (double_conversion *this,Vector<const_char> trimmed,int exponent,double *guess)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  ulong uVar5;
  byte bVar6;
  undefined4 in_register_0000000c;
  double *number_of_read_digits;
  ulong uVar7;
  uint requested_exponent;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  Vector<const_char> buffer_02;
  DiyFp diy_fp;
  DiyFp cached_power;
  DiyFp local_58;
  DiyFp local_48;
  int local_34;
  
  number_of_read_digits = (double *)CONCAT44(in_register_0000000c,exponent);
  uVar8 = (uint)trimmed.start_;
  if (uVar8 == 0) goto LAB_0016e225;
  requested_exponent = trimmed.length_;
  iVar3 = requested_exponent + uVar8;
  if (0x135 < iVar3) {
    *number_of_read_digits = INFINITY;
    return true;
  }
  if (iVar3 < -0x143) goto LAB_0016e225;
  if ((int)uVar8 < 0x10) {
    if (-1 < (int)requested_exponent) {
      if (requested_exponent < 0x17) {
        buffer.start_ = (char *)(ulong)uVar8;
        buffer._8_8_ = &local_58;
        uVar4 = ReadUint64(this,buffer,(int *)number_of_read_digits);
        auVar13._8_4_ = (int)(uVar4 >> 0x20);
        auVar13._0_8_ = uVar4;
        auVar13._12_4_ = 0x45300000;
        dVar12 = (auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
        *number_of_read_digits = dVar12;
        if ((uint)local_58.f_ != uVar8) {
          __assert_fail("read_digits == trimmed.length()",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                        ,0xe3,
                        "bool FIX::double_conversion::DoubleStrtod(Vector<const char>, int, double *)"
                       );
        }
        uVar5 = (ulong)requested_exponent;
      }
      else {
        iVar2 = requested_exponent - (0xf - uVar8);
        if (0x16 < iVar2) goto LAB_0016e198;
        buffer_01.start_ = (char *)(ulong)uVar8;
        buffer_01._8_8_ = &local_58;
        uVar4 = ReadUint64(this,buffer_01,(int *)number_of_read_digits);
        auVar15._8_4_ = (int)(uVar4 >> 0x20);
        auVar15._0_8_ = uVar4;
        auVar15._12_4_ = 0x45300000;
        dVar12 = (auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
        *number_of_read_digits = dVar12;
        if ((uint)local_58.f_ != uVar8) {
          __assert_fail("read_digits == trimmed.length()",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                        ,0xef,
                        "bool FIX::double_conversion::DoubleStrtod(Vector<const char>, int, double *)"
                       );
        }
        dVar12 = dVar12 * *(double *)(exact_powers_of_ten + (ulong)(0xf - uVar8) * 8);
        uVar5 = (ulong)iVar2;
      }
      dVar12 = dVar12 * *(double *)(exact_powers_of_ten + uVar5 * 8);
LAB_0016e18f:
      *number_of_read_digits = dVar12;
      return true;
    }
    if (0xffffffe9 < requested_exponent) {
      buffer_00.start_ = (char *)(ulong)uVar8;
      buffer_00._8_8_ = &local_58;
      uVar4 = ReadUint64(this,buffer_00,(int *)number_of_read_digits);
      auVar14._8_4_ = (int)(uVar4 >> 0x20);
      auVar14._0_8_ = uVar4;
      auVar14._12_4_ = 0x45300000;
      dVar12 = (auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
      *number_of_read_digits = dVar12;
      if ((uint)local_58.f_ != uVar8) {
        __assert_fail("read_digits == trimmed.length()",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                      ,0xdc,
                      "bool FIX::double_conversion::DoubleStrtod(Vector<const char>, int, double *)"
                     );
      }
      dVar12 = dVar12 / *(double *)(exact_powers_of_ten + (ulong)-requested_exponent * 8);
      goto LAB_0016e18f;
    }
  }
LAB_0016e198:
  buffer_02.start_ = (char *)(ulong)uVar8;
  buffer_02._8_8_ = &local_48;
  local_58.f_ = ReadUint64(this,buffer_02,(int *)number_of_read_digits);
  if ((uint)local_48.f_ == uVar8) {
    lVar9 = 0;
  }
  else {
    if (((int)(uint)local_48.f_ < 0) || ((int)uVar8 <= (int)(uint)local_48.f_)) {
      __assert_fail("0 <= index && index < length_",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xcc,
                    "T &FIX::double_conversion::Vector<const char>::operator[](int) const [T = const char]"
                   );
    }
    local_58.f_ = local_58.f_ + ('4' < (char)this[local_48.f_ & 0xffffffff]);
    requested_exponent = iVar3 - (uint)local_48.f_;
    lVar9 = 4;
  }
  local_58.e_ = 0;
  DiyFp::Normalize(&local_58);
  lVar9 = lVar9 << (-(char)local_58.e_ & 0x3fU);
  if (0x154 < (int)requested_exponent) {
    __assert_fail("exponent <= PowersOfTenCache::kMaxDecimalExponent",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                  ,0x129,
                  "bool FIX::double_conversion::DiyFpStrtod(Vector<const char>, int, double *)");
  }
  if (-0x15d < (int)requested_exponent) {
    local_48.f_ = 0;
    local_48.e_ = 0;
    PowersOfTenCache::GetCachedPowerForDecimalExponent(requested_exponent,&local_48,&local_34);
    uVar11 = requested_exponent - local_34;
    if (uVar11 != 0) {
      if (uVar11 == 0 || (int)requested_exponent < local_34) {
        __assert_fail("0 < exponent",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                      ,0xfc,"DiyFp FIX::double_conversion::AdjustmentPowerOfTen(int)");
      }
      if (7 < uVar11) {
        __assert_fail("exponent < PowersOfTenCache::kDecimalExponentDistance",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                      ,0xfd,"DiyFp FIX::double_conversion::AdjustmentPowerOfTen(int)");
      }
      uVar5 = (local_58.f_ & 0xffffffff) * *(long *)(&DAT_001c5570 + (long)(int)uVar11 * 8);
      local_58.f_ = ((ulong)((uint)uVar5 & 0x80000000) + 0x80000000 >> 0x20) +
                    (uVar5 >> 0x20) +
                    (local_58.f_ >> 0x20) * *(long *)(&DAT_001c5570 + (long)(int)uVar11 * 8);
      local_58.e_ = local_58.e_ + *(int *)(&DAT_001c5554 + (long)(int)uVar11 * 4);
      if ((int)(0x13 - uVar8) < (int)uVar11) {
        lVar9 = lVar9 + 4;
      }
    }
    uVar7 = (local_48.f_ >> 0x20) * (local_58.f_ & 0xffffffff);
    uVar5 = (local_58.f_ >> 0x20) * (local_48.f_ & 0xffffffff);
    local_58.f_ = ((uVar7 & 0xffffffff) +
                   (uVar5 & 0xffffffff) +
                   ((local_48.f_ & 0xffffffff) * (local_58.f_ & 0xffffffff) >> 0x20) + 0x80000000 >>
                  0x20) + (uVar7 >> 0x20) +
                          (uVar5 >> 0x20) + (local_48.f_ >> 0x20) * (local_58.f_ >> 0x20);
    uVar8 = local_58.e_ + local_48.e_ + 0x40;
    local_58.e_ = uVar8;
    DiyFp::Normalize(&local_58);
    uVar5 = (9 - (ulong)(lVar9 == 0)) + lVar9 << ((char)uVar8 - (char)local_58.e_ & 0x3fU);
    uVar8 = 0;
    if (0xfffffbce < local_58.e_ + 0x40U) {
      uVar8 = local_58.e_ + 0x472;
    }
    uVar7 = 0x35;
    if (local_58.e_ < -0x43d) {
      uVar7 = (ulong)uVar8;
    }
    iVar3 = (int)uVar7;
    if (iVar3 < 4) {
      bVar6 = (byte)(4 - iVar3);
      local_58.f_ = local_58.f_ >> (bVar6 & 0x3f);
      local_58.e_ = (4 - iVar3) + local_58.e_;
      uVar7 = (ulong)(uint)local_58.e_;
      uVar5 = (uVar5 >> (bVar6 & 0x3f)) + 9;
      iVar3 = 0x3c;
    }
    else {
      iVar3 = 0x40 - iVar3;
    }
    bVar6 = (byte)iVar3;
    uVar10 = (~(-1L << (bVar6 & 0x3f)) & local_58.f_) << 3;
    lVar9 = 8L << (bVar6 - 1 & 0x3f);
    diy_fp.f_ = (ulong)(uint)(local_58.e_ + iVar3);
    uVar1 = uVar5 + lVar9;
    diy_fp._8_8_ = uVar7;
    dVar12 = (double)Double::DiyFpToUint64
                               ((Double *)
                                (((local_58.f_ >> (bVar6 & 0x3f)) + 1) - (ulong)(uVar10 < uVar1)),
                                diy_fp);
    *number_of_read_digits = dVar12;
    if (lVar9 - uVar5 < uVar10) {
      if (uVar10 < uVar1) {
        return INFINITY <= dVar12;
      }
      return true;
    }
    return true;
  }
LAB_0016e225:
  *number_of_read_digits = 0.0;
  return true;
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}